

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall
inja::ForArrayStatementNode::ForArrayStatementNode
          (ForArrayStatementNode *this,string *value,BlockNode *parent,size_t pos)

{
  size_t pos_local;
  BlockNode *parent_local;
  string *value_local;
  ForArrayStatementNode *this_local;
  
  ForStatementNode::ForStatementNode(&this->super_ForStatementNode,parent,pos);
  (this->super_ForStatementNode).super_StatementNode.super_AstNode._vptr_AstNode =
       (_func_int **)&PTR_accept_001c2820;
  ::std::__cxx11::string::string((string *)&this->value,(string *)value);
  return;
}

Assistant:

explicit ForArrayStatementNode(const std::string& value, BlockNode* const parent, size_t pos): ForStatementNode(parent, pos), value(value) {}